

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleSourceMode(cmGetPropertyCommand *this)

{
  cmSourceFile *this_00;
  char *value;
  ostringstream e;
  string local_1a8;
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  if ((this->Name)._M_string_length == 0) {
    local_188._0_8_ = local_188 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"not given name for SOURCE scope.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_188);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
  }
  else {
    this_00 = cmMakefile::GetOrCreateSource((this->super_cmCommand).Makefile,&this->Name,false);
    if (this_00 != (cmSourceFile *)0x0) {
      value = cmSourceFile::GetPropertyForUser(this_00,&this->PropertyName);
      StoreResult(this,value);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"given SOURCE name that could not be found or created: ",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleSourceMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for SOURCE scope.");
    return false;
    }

  // Get the source file.
  if(cmSourceFile* sf =
     this->Makefile->GetOrCreateSource(this->Name))
    {
    return
      this->StoreResult(sf->GetPropertyForUser(this->PropertyName));
    }
  else
    {
    std::ostringstream e;
    e << "given SOURCE name that could not be found or created: "
      << this->Name;
    this->SetError(e.str());
    return false;
    }
}